

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

bool type_do_match_placeholder_proc(Am_Object *ph,Am_Value *new_value,Am_Object *param_3)

{
  Am_Value *in_value;
  Am_Object local_58 [3];
  Am_Object local_40;
  Am_Object new_object;
  Am_Object local_30;
  Am_Object proto;
  Am_Object *param_2_local;
  Am_Value *new_value_local;
  Am_Object *ph_local;
  
  proto.data = (Am_Object_Data *)param_3;
  in_value = Am_Object::Get(ph,0xfa,0);
  Am_Object::Am_Object(&local_30,in_value);
  if (new_value->type == 0xa001) {
    Am_Object::Am_Object(&local_40,new_value);
    Am_Object::Am_Object(local_58,&local_30);
    ph_local._7_1_ = Am_Object::Is_Instance_Of(&local_40,local_58);
    Am_Object::~Am_Object(local_58);
    new_object.data._4_4_ = 1;
    Am_Object::~Am_Object(&local_40);
  }
  else {
    ph_local._7_1_ = false;
    new_object.data._4_4_ = 1;
  }
  Am_Object::~Am_Object(&local_30);
  return ph_local._7_1_;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool, type_do_match_placeholder,
                 (Am_Object & ph, Am_Value &new_value,
                  Am_Object & /* sel_widget */))
{
  Am_Object proto = ph.Get(Am_VALUES);

  if (new_value.type != Am_OBJECT)
    return false;
  Am_Object new_object = new_value;
  if (new_object.Is_Instance_Of(proto))
    return true;
  else
    return false;
}